

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

bool __thiscall
ArbitraryArbitrary_Arithmetic_IntCast::Run(ArbitraryArbitrary_Arithmetic_IntCast *this)

{
  vector<signed_char,_std::allocator<signed_char>_> local_30;
  char local_12 [2];
  char v;
  ArbitraryArbitrary_Arithmetic_IntCast *pAStack_10;
  Arbitrary<signed_char> a;
  ArbitraryArbitrary_Arithmetic_IntCast *this_local;
  
  pAStack_10 = this;
  local_12[0] = testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate(0,0);
  local_12[0] = testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate(1,0);
  local_12[0] = testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate(2,0);
  local_12[0] = testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate(3,0);
  testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::shrink(&local_30,local_12);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&local_30);
  return true;
}

Assistant:

DEF_TEST(Arbitrary_Arithmetic_IntCast, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  v = a.generate(1,0);
  v = a.generate(2,0);
  v = a.generate(3,0);
  a.shrink(v);
  return true;
}